

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall CTcSymObjBase::delete_vocab_prop(CTcSymObjBase *this,tctarg_prop_id_t prop)

{
  CTcVocabEntry *pCVar1;
  CTcVocabEntry *nxt;
  CTcVocabEntry *entry;
  CTcVocabEntry *prv;
  tctarg_prop_id_t prop_local;
  CTcSymObjBase *this_local;
  
  prv = (CTcVocabEntry *)0x0;
  entry = this->vocab_;
  while (entry != (CTcVocabEntry *)0x0) {
    pCVar1 = entry->nxt_;
    if (entry->prop_ == prop) {
      if (prv == (CTcVocabEntry *)0x0) {
        this->vocab_ = pCVar1;
      }
      else {
        prv->nxt_ = pCVar1;
      }
      entry->nxt_ = (CTcVocabEntry *)0x0;
      entry = pCVar1;
    }
    else {
      prv = entry;
      entry = pCVar1;
    }
  }
  return;
}

Assistant:

void CTcSymObjBase::delete_vocab_prop(tctarg_prop_id_t prop)
{
    /* scan my list and delete each word defined for the given property */
    for (CTcVocabEntry *prv = 0, *entry = vocab_, *nxt = 0 ;
         entry != 0 ; entry = nxt)
    {
        /* remember the next entry */
        nxt = entry->nxt_;
        
        /* if this entry is for the given property, unlink it */
        if (entry->prop_ == prop)
        {
            /* 
             *   it matches - unlink it from the list (note that we don't
             *   have to delete the entry, because it's allocated in
             *   parser memory and thus will be deleted when the parser is
             *   deleted) 
             */
            if (prv != 0)
                prv->nxt_ = nxt;
            else
                vocab_ = nxt;

            /* 
             *   this entry is no longer in any list (we don't really have
             *   to clear the 'next' pointer here, since nothing points to
             *   'entry' any more, but doing so will make it obvious that
             *   the entry was removed from the list, which could be handy
             *   during debugging from time to time) 
             */
            entry->nxt_ = 0;
        }
        else
        {
            /* 
             *   this entry is still in the list, so it's now the previous
             *   entry for our scan 
             */
            prv = entry;
        }
    }
}